

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_chainstatemanager_tests.cpp
# Opt level: O0

void __thiscall
validation_chainstatemanager_tests::chainstatemanager_loadblockindex::test_method
          (chainstatemanager_loadblockindex *this)

{
  bool bVar1;
  int iVar2;
  type pCVar3;
  CBlockIndex *pCVar4;
  long in_FS_OFFSET;
  Chainstate *cs2;
  CBlockIndex *index;
  int i;
  int assumed_valid_start_idx;
  int last_assumed_valid_idx;
  int expected_assumed_valid;
  Chainstate *cs1;
  ChainstateManager *chainman;
  anon_class_8_1_3d09f077 reload_all_block_indexes;
  CBlockIndex *assumed_tip;
  CBlockIndex *assumed_base;
  CBlockIndex *validated_tip;
  int num_indexes;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock45;
  char *in_stack_fffffffffffff798;
  lazy_ostream *in_stack_fffffffffffff7a0;
  char *in_stack_fffffffffffff7a8;
  CBlockIndex *in_stack_fffffffffffff7b0;
  CChain *in_stack_fffffffffffff7b8;
  const_string *in_stack_fffffffffffff7c0;
  const_string *msg;
  anon_class_8_1_3d09f077 *in_stack_fffffffffffff7c8;
  undefined1 *line_num;
  const_string *in_stack_fffffffffffff7d0;
  char *file;
  anon_class_16_2_aac224b8 *in_stack_fffffffffffff7d8;
  unit_test_log_t *this_00;
  TestChain100Setup *in_stack_fffffffffffff7e0;
  anon_class_8_1_3d09f077 *in_stack_fffffffffffff7e8;
  int local_5ac;
  lazy_ostream local_56c;
  undefined1 local_550 [32];
  undefined1 local_530 [16];
  const_string local_520;
  lazy_ostream local_50c;
  undefined1 local_4f0 [68];
  lazy_ostream local_4ac;
  undefined1 local_490 [68];
  lazy_ostream local_44c;
  undefined1 local_430 [68];
  lazy_ostream local_3ec;
  undefined1 local_3d0 [68];
  lazy_ostream local_38c;
  undefined1 local_370 [68];
  lazy_ostream local_32c;
  undefined1 local_310 [68];
  lazy_ostream local_2cc;
  undefined1 local_2b0 [68];
  lazy_ostream local_26c;
  undefined1 local_258 [68];
  lazy_ostream local_214;
  undefined1 local_200 [68];
  lazy_ostream local_1bc;
  undefined1 local_1a8 [68];
  lazy_ostream local_164;
  undefined1 local_150 [64];
  type local_110;
  CBlockIndex **local_108;
  lazy_ostream local_fc;
  undefined1 local_e0 [64];
  type local_a0;
  lazy_ostream local_94;
  undefined1 local_80 [64];
  type local_40;
  CBlockIndex *local_38;
  CBlockIndex *local_30;
  CBlockIndex *local_28;
  int local_1c [5];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_fffffffffffff7d8,(char *)in_stack_fffffffffffff7d0,
             (int)((ulong)in_stack_fffffffffffff7c8 >> 0x20),(char *)in_stack_fffffffffffff7c0,
             (char *)in_stack_fffffffffffff7b8);
  pCVar3 = std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator*
                     ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
                      in_stack_fffffffffffff7a8);
  ChainstateManager::ActiveChainstate((ChainstateManager *)in_stack_fffffffffffff7a8);
  local_1c[0] = 0;
  TestChain100Setup::mineBlocks
            (in_stack_fffffffffffff7e0,(int)((ulong)in_stack_fffffffffffff7d8 >> 0x20));
  local_28 = (CBlockIndex *)0x0;
  local_30 = (CBlockIndex *)0x0;
  ChainstateManager::GetMutex((ChainstateManager *)in_stack_fffffffffffff798);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff798);
  local_40 = pCVar3;
  local_38 = test_method::anon_class_8_1_3d09f077::operator()(in_stack_fffffffffffff7c8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7a8,
               (pointer)in_stack_fffffffffffff7a0,(unsigned_long)in_stack_fffffffffffff798);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff798);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d0,
               (size_t)in_stack_fffffffffffff7c8,in_stack_fffffffffffff7c0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff7a0,(char (*) [1])in_stack_fffffffffffff798);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7a8,
               (pointer)in_stack_fffffffffffff7a0,(unsigned_long)in_stack_fffffffffffff798);
    local_94._vptr_lazy_ostream._0_4_ = 0x78;
    in_stack_fffffffffffff7a8 = "120";
    in_stack_fffffffffffff7a0 = &local_94;
    in_stack_fffffffffffff798 = "assumed_tip->nHeight";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_80,(undefined1 *)((long)&local_94._vptr_lazy_ostream + 4),0x1b9,1,2,
               &local_38->nHeight);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff798);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  local_a0 = pCVar3;
  test_method::anon_class_8_1_3d09f077::operator()(in_stack_fffffffffffff7e8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7a8,
               (pointer)in_stack_fffffffffffff7a0,(unsigned_long)in_stack_fffffffffffff798);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff798);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d0,
               (size_t)in_stack_fffffffffffff7c8,in_stack_fffffffffffff7c0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff7a0,(char (*) [1])in_stack_fffffffffffff798);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7a8,
               (pointer)in_stack_fffffffffffff7a0,(unsigned_long)in_stack_fffffffffffff798);
    local_fc._4_8_ =
         std::set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>::
         size((set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_> *
              )in_stack_fffffffffffff798);
    local_fc._vptr_lazy_ostream._0_4_ = 1;
    in_stack_fffffffffffff7a8 = "1";
    in_stack_fffffffffffff7a0 = &local_fc;
    in_stack_fffffffffffff798 = "cs1.setBlockIndexCandidates.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (local_e0,&local_fc.field_0xc,0x1cc,1,2,
               (undefined1 *)((long)&local_fc._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff798);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  for (local_5ac = 0; iVar2 = CChain::Height((CChain *)in_stack_fffffffffffff798),
      local_5ac <= iVar2; local_5ac = local_5ac + 1) {
    MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
              ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff798);
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffff7d8,
               (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff7d0,
               (char *)in_stack_fffffffffffff7c8,(char *)in_stack_fffffffffffff7c0,
               (int)((ulong)in_stack_fffffffffffff7b8 >> 0x20),
               SUB81((ulong)in_stack_fffffffffffff7b8 >> 0x18,0));
    pCVar4 = CChain::operator[]((CChain *)in_stack_fffffffffffff7b0,
                                (int)((ulong)in_stack_fffffffffffff7a8 >> 0x20));
    if ((local_5ac < 0x6f) && (0x5a < local_5ac)) {
      pCVar4->nStatus = 2;
      pCVar4->nTx = 0;
      pCVar4->m_chain_tx_count = 0;
    }
    local_1c[0] = local_1c[0] + 1;
    if (local_5ac == 0x5a) {
      local_28 = pCVar4;
    }
    if (local_5ac == 0x6e) {
      local_30 = pCVar4;
    }
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffff798);
  }
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff798);
  local_108 = &local_30;
  local_110 = pCVar3;
  test_method::anon_class_16_2_aac224b8::operator()(in_stack_fffffffffffff7d8);
  CChain::SetTip(in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b0);
  CChain::SetTip(in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b0);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7a8,
               (pointer)in_stack_fffffffffffff7a0,(unsigned_long)in_stack_fffffffffffff798);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff798);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d0,
               (size_t)in_stack_fffffffffffff7c8,in_stack_fffffffffffff7c0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff7a0,(char (*) [1])in_stack_fffffffffffff798);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7a8,
               (pointer)in_stack_fffffffffffff7a0,(unsigned_long)in_stack_fffffffffffff798);
    local_164._vptr_lazy_ostream._0_4_ = 0x79;
    in_stack_fffffffffffff7a8 = "121";
    in_stack_fffffffffffff7a0 = &local_164;
    in_stack_fffffffffffff798 = "num_indexes";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_150,(undefined1 *)((long)&local_164._vptr_lazy_ostream + 4),0x1f1,1,2,local_1c)
    ;
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff798);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7a8,
               (pointer)in_stack_fffffffffffff7a0,(unsigned_long)in_stack_fffffffffffff798);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff798);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d0,
               (size_t)in_stack_fffffffffffff7c8,in_stack_fffffffffffff7c0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff7a0,(char (*) [1])in_stack_fffffffffffff798);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7a8,
               (pointer)in_stack_fffffffffffff7a0,(unsigned_long)in_stack_fffffffffffff798);
    local_1bc._vptr_lazy_ostream._0_4_ = 0x78;
    in_stack_fffffffffffff7a8 = "120";
    in_stack_fffffffffffff7a0 = &local_1bc;
    in_stack_fffffffffffff798 = "assumed_tip->nHeight";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_1a8,(undefined1 *)((long)&local_1bc._vptr_lazy_ostream + 4),0x1f2,1,2,
               &local_38->nHeight);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff798);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7a8,
               (pointer)in_stack_fffffffffffff7a0,(unsigned_long)in_stack_fffffffffffff798);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff798);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d0,
               (size_t)in_stack_fffffffffffff7c8,in_stack_fffffffffffff7c0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff7a0,(char (*) [1])in_stack_fffffffffffff798);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7a8,
               (pointer)in_stack_fffffffffffff7a0,(unsigned_long)in_stack_fffffffffffff798);
    local_214._vptr_lazy_ostream._0_4_ = 0x5a;
    in_stack_fffffffffffff7a8 = "90";
    in_stack_fffffffffffff7a0 = &local_214;
    in_stack_fffffffffffff798 = "validated_tip->nHeight";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_200,(undefined1 *)((long)&local_214._vptr_lazy_ostream + 4),499,1,2,
               &local_28->nHeight);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff798);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7a8,
               (pointer)in_stack_fffffffffffff7a0,(unsigned_long)in_stack_fffffffffffff798);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff798);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d0,
               (size_t)in_stack_fffffffffffff7c8,in_stack_fffffffffffff7c0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff7a0,(char (*) [1])in_stack_fffffffffffff798);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7a8,
               (pointer)in_stack_fffffffffffff7a0,(unsigned_long)in_stack_fffffffffffff798);
    local_26c._vptr_lazy_ostream._0_4_ = 0x6e;
    in_stack_fffffffffffff7a8 = "110";
    in_stack_fffffffffffff7a0 = &local_26c;
    in_stack_fffffffffffff798 = "assumed_base->nHeight";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_258,(undefined1 *)((long)&local_26c._vptr_lazy_ostream + 4),500,1,2,
               &local_30->nHeight);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff798);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  test_method::anon_class_8_1_3d09f077::operator()(in_stack_fffffffffffff7e8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7a8,
               (pointer)in_stack_fffffffffffff7a0,(unsigned_long)in_stack_fffffffffffff798);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff798);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d0,
               (size_t)in_stack_fffffffffffff7c8,in_stack_fffffffffffff7c0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff7a0,(char (*) [1])in_stack_fffffffffffff798);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7a8,
               (pointer)in_stack_fffffffffffff7a0,(unsigned_long)in_stack_fffffffffffff798);
    local_2cc._4_8_ =
         std::set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>::
         size((set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_> *
              )in_stack_fffffffffffff798);
    local_2cc._vptr_lazy_ostream._0_4_ = 2;
    in_stack_fffffffffffff7a8 = "2";
    in_stack_fffffffffffff7a0 = &local_2cc;
    in_stack_fffffffffffff798 = "cs1.setBlockIndexCandidates.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (local_2b0,&local_2cc.field_0xc,0x20e,1,2,
               (undefined1 *)((long)&local_2cc._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff798);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7a8,
               (pointer)in_stack_fffffffffffff7a0,(unsigned_long)in_stack_fffffffffffff798);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff798);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d0,
               (size_t)in_stack_fffffffffffff7c8,in_stack_fffffffffffff7c0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff7a0,(char (*) [1])in_stack_fffffffffffff798);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7a8,
               (pointer)in_stack_fffffffffffff7a0,(unsigned_long)in_stack_fffffffffffff798);
    local_32c._4_8_ =
         std::set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>::
         count((set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>
                *)in_stack_fffffffffffff7a8,(key_type *)in_stack_fffffffffffff7a0);
    local_32c._vptr_lazy_ostream._0_4_ = 1;
    in_stack_fffffffffffff7a8 = "1";
    in_stack_fffffffffffff7a0 = &local_32c;
    in_stack_fffffffffffff798 = "cs1.setBlockIndexCandidates.count(validated_tip)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (local_310,&local_32c.field_0xc,0x20f,1,2,
               (undefined1 *)((long)&local_32c._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff798);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7a8,
               (pointer)in_stack_fffffffffffff7a0,(unsigned_long)in_stack_fffffffffffff798);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff798);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d0,
               (size_t)in_stack_fffffffffffff7c8,in_stack_fffffffffffff7c0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff7a0,(char (*) [1])in_stack_fffffffffffff798);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7a8,
               (pointer)in_stack_fffffffffffff7a0,(unsigned_long)in_stack_fffffffffffff798);
    local_38c._4_8_ =
         std::set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>::
         count((set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>
                *)in_stack_fffffffffffff7a8,(key_type *)in_stack_fffffffffffff7a0);
    local_38c._vptr_lazy_ostream._0_4_ = 1;
    in_stack_fffffffffffff7a8 = "1";
    in_stack_fffffffffffff7a0 = &local_38c;
    in_stack_fffffffffffff798 = "cs1.setBlockIndexCandidates.count(assumed_base)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (local_370,&local_38c.field_0xc,0x210,1,2,
               (undefined1 *)((long)&local_38c._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff798);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7a8,
               (pointer)in_stack_fffffffffffff7a0,(unsigned_long)in_stack_fffffffffffff798);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff798);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d0,
               (size_t)in_stack_fffffffffffff7c8,in_stack_fffffffffffff7c0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff7a0,(char (*) [1])in_stack_fffffffffffff798);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7a8,
               (pointer)in_stack_fffffffffffff7a0,(unsigned_long)in_stack_fffffffffffff798);
    local_3ec._4_8_ =
         std::set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>::
         count((set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>
                *)in_stack_fffffffffffff7a8,(key_type *)in_stack_fffffffffffff7a0);
    local_3ec._vptr_lazy_ostream._0_4_ = 0;
    in_stack_fffffffffffff7a8 = "0";
    in_stack_fffffffffffff7a0 = &local_3ec;
    in_stack_fffffffffffff798 = "cs2.setBlockIndexCandidates.count(validated_tip)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (local_3d0,&local_3ec.field_0xc,0x220,1,2,
               (undefined1 *)((long)&local_3ec._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff798);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7a8,
               (pointer)in_stack_fffffffffffff7a0,(unsigned_long)in_stack_fffffffffffff798);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff798);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d0,
               (size_t)in_stack_fffffffffffff7c8,in_stack_fffffffffffff7c0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff7a0,(char (*) [1])in_stack_fffffffffffff798);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7a8,
               (pointer)in_stack_fffffffffffff7a0,(unsigned_long)in_stack_fffffffffffff798);
    local_44c._4_8_ =
         std::set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>::
         count((set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>
                *)in_stack_fffffffffffff7a8,(key_type *)in_stack_fffffffffffff7a0);
    local_44c._vptr_lazy_ostream._0_4_ = 0;
    in_stack_fffffffffffff7a8 = "0";
    in_stack_fffffffffffff7a0 = &local_44c;
    in_stack_fffffffffffff798 = "cs2.setBlockIndexCandidates.count(assumed_base->pprev)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (local_430,&local_44c.field_0xc,0x222,1,2,
               (undefined1 *)((long)&local_44c._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff798);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7a8,
               (pointer)in_stack_fffffffffffff7a0,(unsigned_long)in_stack_fffffffffffff798);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff798);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d0,
               (size_t)in_stack_fffffffffffff7c8,in_stack_fffffffffffff7c0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff7a0,(char (*) [1])in_stack_fffffffffffff798);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7a8,
               (pointer)in_stack_fffffffffffff7a0,(unsigned_long)in_stack_fffffffffffff798);
    local_4ac._4_8_ =
         std::set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>::
         count((set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>
                *)in_stack_fffffffffffff7a8,(key_type *)in_stack_fffffffffffff7a0);
    local_4ac._vptr_lazy_ostream._0_4_ = 1;
    in_stack_fffffffffffff7a8 = "1";
    in_stack_fffffffffffff7a0 = &local_4ac;
    in_stack_fffffffffffff798 = "cs2.setBlockIndexCandidates.count(assumed_base)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (local_490,&local_4ac.field_0xc,0x224,1,2,
               (undefined1 *)((long)&local_4ac._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff798);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7a8,
               (pointer)in_stack_fffffffffffff7a0,(unsigned_long)in_stack_fffffffffffff798);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff798);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d0,
               (size_t)in_stack_fffffffffffff7c8,in_stack_fffffffffffff7c0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff7a0,(char (*) [1])in_stack_fffffffffffff798);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7a8,
               (pointer)in_stack_fffffffffffff7a0,(unsigned_long)in_stack_fffffffffffff798);
    local_50c._4_8_ =
         std::set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>::
         count((set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>
                *)in_stack_fffffffffffff7a8,(key_type *)in_stack_fffffffffffff7a0);
    local_50c._vptr_lazy_ostream._0_4_ = 1;
    in_stack_fffffffffffff7a8 = "1";
    in_stack_fffffffffffff7a0 = &local_50c;
    in_stack_fffffffffffff798 = "cs2.setBlockIndexCandidates.count(assumed_tip)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (local_4f0,&local_50c.field_0xc,0x226,1,2,
               (undefined1 *)((long)&local_50c._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff798);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    file = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
    ;
    msg = &local_520;
    this_00 = (unit_test_log_t *)0x7b;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7a8,
               (pointer)in_stack_fffffffffffff7a0,(unsigned_long)in_stack_fffffffffffff798);
    line_num = local_530;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff798);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_00,(const_string *)file,(size_t)line_num,msg);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff7a0,(char (*) [1])in_stack_fffffffffffff798);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7a8,
               (pointer)in_stack_fffffffffffff7a0,(unsigned_long)in_stack_fffffffffffff798);
    local_56c._4_8_ =
         std::set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>::
         size((set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_> *
              )in_stack_fffffffffffff798);
    local_56c._vptr_lazy_ostream._0_4_ = local_1c[0] + -0x6e;
    in_stack_fffffffffffff7a8 = "num_indexes - last_assumed_valid_idx + 1";
    in_stack_fffffffffffff7a0 = &local_56c;
    in_stack_fffffffffffff798 = "cs2.setBlockIndexCandidates.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (local_550,&local_56c.field_0xc,0x228,1,2,
               (undefined1 *)((long)&local_56c._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff798);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_FIXTURE_TEST_CASE(chainstatemanager_loadblockindex, TestChain100Setup)
{
    ChainstateManager& chainman = *Assert(m_node.chainman);
    Chainstate& cs1 = chainman.ActiveChainstate();

    int num_indexes{0};
    // Blocks in range [assumed_valid_start_idx, last_assumed_valid_idx) will be
    // marked as assumed-valid and not having data.
    const int expected_assumed_valid{20};
    const int last_assumed_valid_idx{111};
    const int assumed_valid_start_idx = last_assumed_valid_idx - expected_assumed_valid;

    // Mine to height 120, past the hardcoded regtest assumeutxo snapshot at
    // height 110
    mineBlocks(20);

    CBlockIndex* validated_tip{nullptr};
    CBlockIndex* assumed_base{nullptr};
    CBlockIndex* assumed_tip{WITH_LOCK(chainman.GetMutex(), return chainman.ActiveChain().Tip())};
    BOOST_CHECK_EQUAL(assumed_tip->nHeight, 120);

    auto reload_all_block_indexes = [&]() {
        // For completeness, we also reset the block sequence counters to
        // ensure that no state which affects the ranking of tip-candidates is
        // retained (even though this isn't strictly necessary).
        WITH_LOCK(::cs_main, return chainman.ResetBlockSequenceCounters());
        for (Chainstate* cs : chainman.GetAll()) {
            LOCK(::cs_main);
            cs->ClearBlockIndexCandidates();
            BOOST_CHECK(cs->setBlockIndexCandidates.empty());
        }

        WITH_LOCK(::cs_main, chainman.LoadBlockIndex());
    };

    // Ensure that without any assumed-valid BlockIndex entries, only the current tip is
    // considered as a candidate.
    reload_all_block_indexes();
    BOOST_CHECK_EQUAL(cs1.setBlockIndexCandidates.size(), 1);

    // Reset some region of the chain's nStatus, removing the HAVE_DATA flag.
    for (int i = 0; i <= cs1.m_chain.Height(); ++i) {
        LOCK(::cs_main);
        auto index = cs1.m_chain[i];

        // Blocks with heights in range [91, 110] are marked as missing data.
        if (i < last_assumed_valid_idx && i >= assumed_valid_start_idx) {
            index->nStatus = BlockStatus::BLOCK_VALID_TREE;
            index->nTx = 0;
            index->m_chain_tx_count = 0;
        }

        ++num_indexes;

        // Note the last fully-validated block as the expected validated tip.
        if (i == (assumed_valid_start_idx - 1)) {
            validated_tip = index;
        }
        // Note the last assumed valid block as the snapshot base
        if (i == last_assumed_valid_idx - 1) {
            assumed_base = index;
        }
    }

    // Note: cs2's tip is not set when ActivateExistingSnapshot is called.
    Chainstate& cs2 = WITH_LOCK(::cs_main,
        return chainman.ActivateExistingSnapshot(*assumed_base->phashBlock));

    // Set tip of the fully validated chain to be the validated tip
    cs1.m_chain.SetTip(*validated_tip);

    // Set tip of the assume-valid-based chain to the assume-valid block
    cs2.m_chain.SetTip(*assumed_base);

    // Sanity check test variables.
    BOOST_CHECK_EQUAL(num_indexes, 121); // 121 total blocks, including genesis
    BOOST_CHECK_EQUAL(assumed_tip->nHeight, 120);  // original chain has height 120
    BOOST_CHECK_EQUAL(validated_tip->nHeight, 90); // current cs1 chain has height 90
    BOOST_CHECK_EQUAL(assumed_base->nHeight, 110); // current cs2 chain has height 110

    // Regenerate cs1.setBlockIndexCandidates and cs2.setBlockIndexCandidate and
    // check contents below.
    reload_all_block_indexes();

    // The fully validated chain should only have the current validated tip and
    // the assumed valid base as candidates, blocks 90 and 110. Specifically:
    //
    // - It does not have blocks 0-89 because they contain less work than the
    //   chain tip.
    //
    // - It has block 90 because it has data and equal work to the chain tip,
    //   (since it is the chain tip).
    //
    // - It does not have blocks 91-109 because they do not contain data.
    //
    // - It has block 110 even though it does not have data, because
    //   LoadBlockIndex has a special case to always add the snapshot block as a
    //   candidate. The special case is only actually intended to apply to the
    //   snapshot chainstate cs2, not the background chainstate cs1, but it is
    //   written broadly and applies to both.
    //
    // - It does not have any blocks after height 110 because cs1 is a background
    //   chainstate, and only blocks where are ancestors of the snapshot block
    //   are added as candidates for the background chainstate.
    BOOST_CHECK_EQUAL(cs1.setBlockIndexCandidates.size(), 2);
    BOOST_CHECK_EQUAL(cs1.setBlockIndexCandidates.count(validated_tip), 1);
    BOOST_CHECK_EQUAL(cs1.setBlockIndexCandidates.count(assumed_base), 1);

    // The assumed-valid tolerant chain has the assumed valid base as a
    // candidate, but otherwise has none of the assumed-valid (which do not
    // HAVE_DATA) blocks as candidates.
    //
    // Specifically:
    // - All blocks below height 110 are not candidates, because cs2 chain tip
    //   has height 110 and they have less work than it does.
    //
    // - Block 110 is a candidate even though it does not have data, because it
    //   is the snapshot block, which is assumed valid.
    //
    // - Blocks 111-120 are added because they have data.

    // Check that block 90 is absent
    BOOST_CHECK_EQUAL(cs2.setBlockIndexCandidates.count(validated_tip), 0);
    // Check that block 109 is absent
    BOOST_CHECK_EQUAL(cs2.setBlockIndexCandidates.count(assumed_base->pprev), 0);
    // Check that block 110 is present
    BOOST_CHECK_EQUAL(cs2.setBlockIndexCandidates.count(assumed_base), 1);
    // Check that block 120 is present
    BOOST_CHECK_EQUAL(cs2.setBlockIndexCandidates.count(assumed_tip), 1);
    // Check that 11 blocks total are present.
    BOOST_CHECK_EQUAL(cs2.setBlockIndexCandidates.size(), num_indexes - last_assumed_valid_idx + 1);
}